

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::TestCaseInfo::internalAppendTag(TestCaseInfo *this,StringRef tagStr)

{
  string *psVar1;
  size_type sVar2;
  size_type sVar3;
  StringRef local_60;
  StringRef local_50;
  StringRef tagStr_local;
  
  tagStr_local.m_size = tagStr.m_size;
  tagStr_local.m_start = tagStr.m_start;
  psVar1 = &this->backingTags;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (psVar1,'[');
  sVar2 = (this->backingTags)._M_string_length;
  operator+=(psVar1,&tagStr_local);
  sVar3 = (this->backingTags)._M_string_length;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (psVar1,']');
  psVar1 = &this->backingLCaseTags;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (psVar1,'[');
  operator+=(psVar1,&tagStr_local);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (psVar1,']');
  local_50.m_start = (this->backingTags)._M_dataplus._M_p + sVar2;
  local_60.m_size = sVar3 - sVar2;
  local_60.m_start = (this->backingLCaseTags)._M_dataplus._M_p + sVar2;
  local_50.m_size = local_60.m_size;
  std::vector<Catch::Tag,std::allocator<Catch::Tag>>::
  emplace_back<Catch::StringRef,Catch::StringRef>
            ((vector<Catch::Tag,std::allocator<Catch::Tag>> *)&this->tags,&local_50,&local_60);
  return;
}

Assistant:

void TestCaseInfo::internalAppendTag(StringRef tagStr) {
        backingTags += '[';
        const auto backingStart = backingTags.size();
        backingTags += tagStr;
        const auto backingEnd = backingTags.size();
        backingTags += ']';
        backingLCaseTags += '[';
        // We append the tag to the lower-case backing storage as-is,
        // because we will perform the lower casing later, in bulk
        backingLCaseTags += tagStr;
        backingLCaseTags += ']';
        tags.emplace_back(StringRef(backingTags.c_str() + backingStart, backingEnd - backingStart),
            StringRef(backingLCaseTags.c_str() + backingStart, backingEnd - backingStart));
    }